

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

void cmime_message_prepend_subject(CMimeMessage_T *message,char *s)

{
  char *pcVar1;
  char *local_28;
  char *new_subject;
  
  local_28 = (char *)0x0;
  pcVar1 = cmime_message_get_subject(message);
  asprintf(&local_28,"%s %s",s,pcVar1);
  cmime_message_set_subject(message,local_28);
  free(local_28);
  return;
}

Assistant:

void cmime_message_prepend_subject(CMimeMessage_T *message, const char *s) {
    char *orig_subject = NULL;
    char *new_subject = NULL;

    orig_subject = cmime_message_get_subject(message);
    asprintf(&new_subject, "%s %s", s, orig_subject);
    cmime_message_set_subject(message, new_subject);
    if(new_subject != NULL)
        free(new_subject);
}